

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O0

void vkt::pipeline::anon_unknown_0::swizzleFromSRGB
               (ConstPixelBufferAccess *src,PixelBufferAccess *dst,VkComponentMapping *swz)

{
  int iVar1;
  VkComponentMapping *this;
  int iVar2;
  undefined1 local_5c [16];
  Vector<float,_4> local_4c;
  Vec4 local_3c;
  int local_2c;
  int local_28;
  int x;
  int y;
  int z;
  VkComponentMapping *swz_local;
  PixelBufferAccess *dst_local;
  ConstPixelBufferAccess *src_local;
  
  x = 0;
  _y = swz;
  swz_local = (VkComponentMapping *)dst;
  dst_local = (PixelBufferAccess *)src;
  while( true ) {
    iVar1 = x;
    iVar2 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)swz_local);
    if (iVar2 <= iVar1) break;
    local_28 = 0;
    while( true ) {
      iVar1 = local_28;
      iVar2 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)swz_local);
      if (iVar2 <= iVar1) break;
      local_2c = 0;
      while( true ) {
        iVar1 = local_2c;
        iVar2 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)swz_local);
        this = swz_local;
        if (iVar2 <= iVar1) break;
        tcu::ConstPixelBufferAccess::getPixelT<float>
                  ((ConstPixelBufferAccess *)local_5c,(int)dst_local,local_2c,local_28);
        tcu::sRGBToLinear((tcu *)&local_4c,(Vec4 *)local_5c);
        swizzle<float>((anon_unknown_0 *)&local_3c,&local_4c,_y);
        tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)this,&local_3c,local_2c,local_28,x);
        local_2c = local_2c + 1;
      }
      local_28 = local_28 + 1;
    }
    x = x + 1;
  }
  return;
}

Assistant:

void swizzleFromSRGB (const tcu::ConstPixelBufferAccess& src, const tcu::PixelBufferAccess& dst, const vk::VkComponentMapping& swz)
{
	for (int z = 0; z < dst.getDepth(); ++z)
	for (int y = 0; y < dst.getHeight(); ++y)
	for (int x = 0; x < dst.getWidth(); ++x)
		dst.setPixel(swizzle(tcu::sRGBToLinear(src.getPixelT<float>(x, y, z)), swz), x, y, z);
}